

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_mem(ParamDict *this,char **mem)

{
  long *in_RSI;
  Allocator *in_RDI;
  bool is_float_1;
  int _n_3;
  int _b_3;
  int nscan_1;
  char vstr_1 [16];
  int *ptr_1;
  float *ptr;
  bool is_float;
  int _n_2;
  int _b_2;
  char vstr [16];
  int j;
  int _n_1;
  int _b_1;
  int nscan;
  int len;
  bool is_array;
  int _n;
  int _b;
  int id;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int local_b0;
  int local_ac;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_88 [16];
  int *local_78;
  float *local_70;
  undefined1 local_65;
  int local_64;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar1;
  undefined1 local_58 [20];
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  undefined1 local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  
  local_18 = in_RSI;
  clear((ParamDict *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_1c = 0;
  do {
    local_20 = 0;
    local_24 = __isoc99_sscanf(*local_18,"%d=%n",&local_1c,&local_20);
    *local_18 = *local_18 + (long)local_20;
    local_ac = local_24;
    if (local_20 < 1) {
      local_ac = 0;
    }
    local_28 = local_ac;
    if (local_ac != 1) {
      return 0;
    }
    local_29 = local_1c < -0x5b03;
    if ((bool)local_29) {
      local_1c = -0x5b04 - local_1c;
      local_30 = 0;
      local_38 = 0;
      local_3c = __isoc99_sscanf(*local_18,"%d%n",&local_30,&local_38);
      *local_18 = *local_18 + (long)local_38;
      local_b0 = local_3c;
      if (local_38 < 1) {
        local_b0 = 0;
      }
      local_40 = local_b0;
      local_34 = local_b0;
      if (local_b0 != 1) {
        fprintf(_stderr,"ParamDict read array length fail\n");
        return -1;
      }
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff6c,
                  CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_RDI);
      for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
        iVar1 = 0;
        in_stack_ffffffffffffff4c =
             __isoc99_sscanf(*local_18,",%15[^,\n ]%n",local_58,&stack0xffffffffffffffa4);
        *local_18 = *local_18 + (long)iVar1;
        if (iVar1 < 1) {
          in_stack_ffffffffffffff4c = 0;
        }
        local_64 = in_stack_ffffffffffffff4c;
        local_34 = in_stack_ffffffffffffff4c;
        if (in_stack_ffffffffffffff4c != 1) {
          fprintf(_stderr,"ParamDict read array element fail\n");
          return -1;
        }
        local_65 = vstr_is_float((char *)CONCAT44(1,in_stack_ffffffffffffff48));
        if ((bool)local_65) {
          local_70 = Mat::operator_cast_to_float_((Mat *)(in_RDI + (long)local_1c * 0x40 + 0x18));
          local_34 = __isoc99_sscanf(local_58,"%f",local_70 + local_44);
        }
        else {
          local_78 = Mat::operator_cast_to_int_((Mat *)(in_RDI + (long)local_1c * 0x40 + 0x18));
          local_34 = __isoc99_sscanf(local_58,"%d",local_78 + local_44);
        }
        if (local_34 != 1) {
          fprintf(_stderr,"ParamDict parse array element fail\n");
          return -1;
        }
      }
    }
    else {
      in_stack_ffffffffffffff70 = 0;
      in_stack_ffffffffffffff6c =
           __isoc99_sscanf(*local_18,"%15s%n",local_88,&stack0xffffffffffffff70);
      *local_18 = *local_18 + (long)in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffff6c;
      if (in_stack_ffffffffffffff70 < 1) {
        in_stack_ffffffffffffff48 = 0;
      }
      if (in_stack_ffffffffffffff48 != 1) {
        fprintf(_stderr,"ParamDict read value fail\n");
        return -1;
      }
      in_stack_ffffffffffffff67 = vstr_is_float((char *)CONCAT44(in_stack_ffffffffffffff4c,1));
      if ((bool)in_stack_ffffffffffffff67) {
        iVar1 = __isoc99_sscanf(local_88,"%f",in_RDI + (long)local_1c * 0x40 + 0x14);
      }
      else {
        iVar1 = __isoc99_sscanf(local_88,"%d",in_RDI + (long)local_1c * 0x40 + 0x14);
      }
      if (iVar1 != 1) {
        fprintf(_stderr,"ParamDict parse value fail\n");
        return -1;
      }
      in_stack_ffffffffffffff74 = 1;
    }
    *(undefined4 *)(in_RDI + (long)local_1c * 0x40 + 0x10) = 1;
  } while( true );
}

Assistant:

int ParamDict::load_param_mem(const char*& mem){
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (mem_sscanf(mem, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = mem_sscanf(mem, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = mem_sscanf(mem, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = mem_sscanf(mem, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }
    return 0;
}